

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_compute_fluxes_from_state.cpp
# Opt level: O1

void HydroUtils::ComputeFluxesOnBoxFromState
               (Box *bx,int ncomp,MFIter *mfi,Array4<const_double> *q,Array4<double> *flux_x,
               Array4<double> *flux_y,Array4<double> *flux_z,Array4<double> *face_x,
               Array4<double> *face_y,Array4<double> *face_z,bool knownFaceState,
               Array4<const_double> *u_mac,Array4<const_double> *v_mac,Array4<const_double> *w_mac,
               Array4<const_double> *divu,Array4<const_double> *fq,Geometry geom,Real l_dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec,
               int *iconserv,EBFArrayBoxFactory *ebfact,Array4<const_double> *values_on_eb_inflow,
               bool godunov_use_ppm,bool godunov_use_forces_in_trans,bool is_velocity,
               bool fluxes_are_area_weighted,string *advection_type)

{
  Box *pBVar1;
  EBCellFlagFab *this;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Geometry geom_00;
  Geometry geom_01;
  bool bVar5;
  FabType FVar6;
  int iVar7;
  FabArray<amrex::EBCellFlagFab> *pFVar8;
  FabArray<amrex::FArrayBox> *this_00;
  MultiCutFab *this_01;
  Arena *arena;
  int *piVar9;
  Geometry *pGVar10;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffba0 [48];
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  Box result;
  undefined4 uStack_33c;
  Dim3 local_338;
  int iStack_32c;
  IndexType IStack_328;
  int local_324;
  int local_320;
  Elixir eli;
  Array4<const_amrex::EBCellFlag> local_2b8;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Array4<const_double> local_70;
  
  bVar15 = 0;
  pFVar8 = amrex::EBDataCollection::getMultiEBCellFlagFab
                     ((ebfact->m_ebdc).
                      super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     );
  piVar9 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar9 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + *piVar9;
  }
  this = (pFVar8->m_fabs_v).
         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>._M_impl
         .super__Vector_impl_data._M_start[*piVar9];
  local_2b8.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
  local_2b8.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
  pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
  local_2b8.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
  local_2b8.begin.x = (pBVar1->smallend).vect[0];
  local_2b8.begin.y = (pBVar1->smallend).vect[1];
  lVar11 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
  lVar13 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
  lVar14 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
  local_2b8.jstride = (lVar13 - (pBVar1->smallend).vect[0]) + 1;
  local_2b8.kstride =
       (lVar11 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
       local_2b8.jstride;
  local_2b8.nstride = (lVar14 - local_2b8.begin.z) * local_2b8.kstride;
  local_2b8.end._0_8_ = lVar13 + 1U & 0xffffffff | lVar11 << 0x20;
  local_2b8.end.z = (int)lVar14;
  fcx.kstride = 0;
  fcx.nstride = 0;
  fcx.p = (double *)0x0;
  fcx.jstride = 0;
  fcx.begin.x = 1;
  fcx.begin.y = 1;
  fcx.begin.z = 1;
  fcx.end.x = 0;
  fcx.end.y = 0;
  fcx.end.z = 0;
  fcx.ncomp = 0;
  fcy.kstride = 0;
  fcy.nstride = 0;
  fcy.p = (double *)0x0;
  fcy.jstride = 0;
  fcy.begin.x = 1;
  fcy.begin.y = 1;
  fcy.begin.z = 1;
  fcy.end.x = 0;
  fcy.end.y = 0;
  fcy.end.z = 0;
  fcy.ncomp = 0;
  fcz.kstride = 0;
  fcz.nstride = 0;
  fcz.p = (double *)0x0;
  fcz.jstride = 0;
  fcz.begin.x = 1;
  fcz.begin.y = 1;
  fcz.begin.z = 1;
  fcz.end.x = 0;
  fcz.end.y = 0;
  fcz.end.z = 0;
  fcz.ncomp = 0;
  ccc.kstride = 0;
  ccc.nstride = 0;
  ccc.p = (double *)0x0;
  ccc.jstride = 0;
  ccc.begin.x = 1;
  ccc.begin.y = 1;
  ccc.begin.z = 1;
  ccc.end.x = 0;
  ccc.end.y = 0;
  ccc.end.z = 0;
  ccc.ncomp = 0;
  vfrac.kstride = 0;
  vfrac.nstride = 0;
  vfrac.p = (double *)0x0;
  vfrac.jstride = 0;
  vfrac.begin.x = 1;
  vfrac.begin.y = 1;
  vfrac.begin.z = 1;
  vfrac.end.x = 0;
  vfrac.end.y = 0;
  vfrac.end.z = 0;
  vfrac.ncomp = 0;
  apx.kstride = 0;
  apx.nstride = 0;
  apx.p = (double *)0x0;
  apx.jstride = 0;
  apx.begin.x = 1;
  apx.begin.y = 1;
  apx.begin.z = 1;
  apx.end.x = 0;
  apx.end.y = 0;
  apx.end.z = 0;
  apx.ncomp = 0;
  apy.kstride = 0;
  apy.nstride = 0;
  apy.p = (double *)0x0;
  apy.jstride = 0;
  apy.begin.x = 1;
  apy.begin.y = 1;
  apy.begin.z = 1;
  apy.end.x = 0;
  apy.end.y = 0;
  apy.end.z = 0;
  apy.ncomp = 0;
  apz.kstride = 0;
  apz.nstride = 0;
  apz.p = (double *)0x0;
  apz.jstride = 0;
  apz.begin.x = 1;
  apz.begin.y = 1;
  apz.begin.z = 1;
  apz.end.x = 0;
  apz.end.y = 0;
  apz.end.z = 0;
  apz.ncomp = 0;
  FVar6 = amrex::EBCellFlagFab::getType(this,bx);
  if (FVar6 != covered) {
    uVar2 = *(undefined8 *)(bx->smallend).vect;
    uVar3 = *(undefined8 *)((bx->smallend).vect + 2);
    uVar4 = *(undefined8 *)((bx->bigend).vect + 2);
    result.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
    result.bigend.vect[2] = (int)uVar4;
    result.btype.itype = (uint)((ulong)uVar4 >> 0x20);
    result.smallend.vect[2] = (int)uVar3;
    result.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
    result.smallend.vect[0] = (int)uVar2;
    result.smallend.vect[1] = (int)((ulong)uVar2 >> 0x20);
    result.smallend.vect[2] = result.smallend.vect[2] + -3;
    result.bigend.vect[0] = result.bigend.vect[0] + 3;
    result.smallend.vect[1] = result.smallend.vect[1] + -3;
    result.smallend.vect[0] = result.smallend.vect[0] + -3;
    result.bigend.vect[1] = result.bigend.vect[1] + 3;
    result.bigend.vect[2] = result.bigend.vect[2] + 3;
    FVar6 = amrex::EBCellFlagFab::getType(this,&result);
    if (FVar6 != regular) {
      this_00 = &amrex::EBDataCollection::getVolFrac
                           ((ebfact->m_ebdc).
                            super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&result,this_00,mfi);
      vfrac.jstride._4_4_ = result.bigend.vect[0];
      vfrac.jstride._0_4_ = result.smallend.vect[2];
      vfrac.kstride._4_4_ = result.bigend.vect[2];
      vfrac.kstride._0_4_ = result.bigend.vect[1];
      vfrac.nstride._4_4_ = uStack_33c;
      vfrac.nstride._0_4_ = result.btype.itype;
      vfrac.ncomp = local_320;
      vfrac.end.z = local_324;
      vfrac.end.y = IStack_328.itype;
      vfrac.begin._0_8_ = local_338._0_8_;
      vfrac.begin.z = local_338.z;
      vfrac.end.x = iStack_32c;
      vfrac.p = (double *)result.smallend.vect._0_8_;
      this_01 = amrex::EBDataCollection::getCentroid
                          ((ebfact->m_ebdc).
                           super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      amrex::MultiCutFab::const_array((Array4<const_double> *)&result,this_01,mfi);
      ccc.jstride._4_4_ = result.bigend.vect[0];
      ccc.jstride._0_4_ = result.smallend.vect[2];
      ccc.kstride._4_4_ = result.bigend.vect[2];
      ccc.kstride._0_4_ = result.bigend.vect[1];
      ccc.nstride._4_4_ = uStack_33c;
      ccc.nstride._0_4_ = result.btype.itype;
      ccc.ncomp = local_320;
      ccc.end.z = local_324;
      ccc.end.y = IStack_328.itype;
      ccc.begin._0_8_ = local_338._0_8_;
      ccc.begin.z = local_338.z;
      ccc.end.x = iStack_32c;
      ccc.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getAreaFrac
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 eli.m_pa.
                 super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                 .
                 super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,mfi);
      apx.jstride._4_4_ = result.bigend.vect[0];
      apx.jstride._0_4_ = result.smallend.vect[2];
      apx.kstride._4_4_ = result.bigend.vect[2];
      apx.kstride._0_4_ = result.bigend.vect[1];
      apx.nstride._4_4_ = uStack_33c;
      apx.nstride._0_4_ = result.btype.itype;
      apx.ncomp = local_320;
      apx.end.z = local_324;
      apx.end.y = IStack_328.itype;
      apx.begin._0_8_ = local_338._0_8_;
      apx.begin.z = local_338.z;
      apx.end.x = iStack_32c;
      apx.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getAreaFrac
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 CONCAT44(eli.m_pa.
                          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          .
                          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)eli.m_pa.
                               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               .
                               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish),mfi);
      apy.jstride._4_4_ = result.bigend.vect[0];
      apy.jstride._0_4_ = result.smallend.vect[2];
      apy.kstride._4_4_ = result.bigend.vect[2];
      apy.kstride._0_4_ = result.bigend.vect[1];
      apy.nstride._4_4_ = uStack_33c;
      apy.nstride._0_4_ = result.btype.itype;
      apy.ncomp = local_320;
      apy.end.z = local_324;
      apy.end.y = IStack_328.itype;
      apy.begin._0_8_ = local_338._0_8_;
      apy.begin.z = local_338.z;
      apy.end.x = iStack_32c;
      apy.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getAreaFrac
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 CONCAT44(eli.m_pa.
                          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          .
                          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (int)eli.m_pa.
                               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               .
                               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),mfi);
      apz.jstride._4_4_ = result.bigend.vect[0];
      apz.jstride._0_4_ = result.smallend.vect[2];
      apz.kstride._4_4_ = result.bigend.vect[2];
      apz.kstride._0_4_ = result.bigend.vect[1];
      apz.nstride._4_4_ = uStack_33c;
      apz.nstride._0_4_ = result.btype.itype;
      apz.ncomp = local_320;
      apz.end.z = local_324;
      apz.end.y = IStack_328.itype;
      apz.begin._0_8_ = local_338._0_8_;
      apz.begin.z = local_338.z;
      apz.end.x = iStack_32c;
      apz.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getFaceCent
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 eli.m_pa.
                 super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                 .
                 super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,mfi);
      fcx.jstride._4_4_ = result.bigend.vect[0];
      fcx.jstride._0_4_ = result.smallend.vect[2];
      fcx.kstride._4_4_ = result.bigend.vect[2];
      fcx.kstride._0_4_ = result.bigend.vect[1];
      fcx.nstride._4_4_ = uStack_33c;
      fcx.nstride._0_4_ = result.btype.itype;
      fcx.ncomp = local_320;
      fcx.end.z = local_324;
      fcx.end.y = IStack_328.itype;
      fcx.begin._0_8_ = local_338._0_8_;
      fcx.begin.z = local_338.z;
      fcx.end.x = iStack_32c;
      fcx.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getFaceCent
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 CONCAT44(eli.m_pa.
                          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          .
                          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)eli.m_pa.
                               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               .
                               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish),mfi);
      fcy.jstride._4_4_ = result.bigend.vect[0];
      fcy.jstride._0_4_ = result.smallend.vect[2];
      fcy.kstride._4_4_ = result.bigend.vect[2];
      fcy.kstride._0_4_ = result.bigend.vect[1];
      fcy.nstride._4_4_ = uStack_33c;
      fcy.nstride._0_4_ = result.btype.itype;
      fcy.ncomp = local_320;
      fcy.end.z = local_324;
      fcy.end.y = IStack_328.itype;
      fcy.begin._0_8_ = local_338._0_8_;
      fcy.begin.z = local_338.z;
      fcy.end.x = iStack_32c;
      fcy.p = (double *)result.smallend.vect._0_8_;
      amrex::EBDataCollection::getFaceCent
                ((ebfact->m_ebdc).
                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)&result,
                 (MultiCutFab *)
                 CONCAT44(eli.m_pa.
                          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          .
                          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (int)eli.m_pa.
                               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               .
                               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),mfi);
      fcz.jstride._4_4_ = result.bigend.vect[0];
      fcz.jstride._0_4_ = result.smallend.vect[2];
      fcz.kstride._4_4_ = result.bigend.vect[2];
      fcz.kstride._0_4_ = result.bigend.vect[1];
      fcz.nstride._4_4_ = uStack_33c;
      fcz.nstride._0_4_ = result.btype.itype;
      fcz.ncomp = local_320;
      fcz.end.z = local_324;
      fcz.end.y = IStack_328.itype;
      fcz.begin._0_8_ = local_338._0_8_;
      fcz.begin.z = local_338.z;
      fcz.end.x = iStack_32c;
      fcz.p = (double *)result.smallend.vect._0_8_;
    }
    if (!knownFaceState) {
      iVar7 = std::__cxx11::string::compare((char *)advection_type);
      if (iVar7 == 0) {
        if (FVar6 == regular) {
          MOL::ComputeEdgeState
                    (bx,face_x,face_y,face_z,q,ncomp,u_mac,v_mac,w_mac,&geom.domain,h_bcrec,d_bcrec,
                     is_velocity);
        }
        else {
          EBMOL::ComputeEdgeState
                    (bx,face_x,face_y,face_z,q,ncomp,u_mac,v_mac,w_mac,&geom.domain,h_bcrec,d_bcrec,
                     &fcx,&fcy,&fcz,&ccc,&vfrac,&local_2b8,is_velocity);
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)advection_type);
        if (iVar7 == 0) {
          uVar2 = *(undefined8 *)(bx->smallend).vect;
          uVar3 = *(undefined8 *)((bx->smallend).vect + 2);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               (int)*(undefined8 *)((bx->bigend).vect + 2);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)uVar3;
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)uVar3 >> 0x20);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)uVar2;
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)uVar2 >> 0x20);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
               (int)eli.m_pa.
                    super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                    .
                    super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -4;
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
               eli.m_pa.
               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               .
               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._4_4_ + 4;
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(eli.m_pa.
                                 super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                 .
                                 super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_ + -4,
                                 (int)eli.m_pa.
                                      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                      .
                                      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -4);
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)eli.m_pa.
                    super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                    .
                    super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4;
          eli.m_pa.
          super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          .
          super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               eli.m_pa.
               super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               .
               super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 4;
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)&result,(Box *)&eli,ncomp * 0xe,true,false,(Arena *)0x0);
          arena = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
          if (arena == (Arena *)0x0) {
            arena = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,arena);
          if (FVar6 == regular) {
            pGVar10 = &geom;
            puVar12 = (undefined8 *)&stack0xfffffffffffffb90;
            for (lVar11 = 0x19; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar12 = *(undefined8 *)&pGVar10->super_CoordSys;
              pGVar10 = (Geometry *)((long)pGVar10 + (ulong)bVar15 * -0x10 + 8);
              puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
            }
            geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffffb98;
            geom_00.super_CoordSys._0_8_ = in_stack_fffffffffffffb90;
            geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffffba0._0_8_;
            geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffffba0._8_8_;
            geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffffba0._16_8_;
            geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffffba0._24_8_;
            geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffffba0._32_8_;
            geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffffba0._40_8_;
            geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffffbd0;
            geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffffbd8;
            geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffffbe0;
            geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffffbe8;
            geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffffbf0;
            geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffffbf8;
            geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffffc00;
            geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffffc08;
            geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffffc10;
            geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffffc18;
            geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffffc20;
            geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffffc28;
            geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffffc30;
            geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
            geom_00.roundoff_hi_f.arr[2] = (float)(int)in_stack_fffffffffffffc38;
            geom_00.domain.smallend.vect[0] = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
            geom_00.domain.smallend.vect[1] = (int)in_stack_fffffffffffffc40;
            geom_00.domain.smallend.vect[2] = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
            geom_00.domain.bigend.vect[0] = (int)in_stack_fffffffffffffc48;
            geom_00.domain.bigend.vect[1] = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
            geom_00.domain.bigend.vect[2] = (int)in_stack_fffffffffffffc50;
            geom_00.domain.btype.itype = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
            Godunov::ComputeEdgeState
                      (bx,ncomp,q,face_x,face_y,face_z,u_mac,v_mac,w_mac,divu,fq,geom_00,l_dt,
                       d_bcrec,iconserv,godunov_use_ppm,godunov_use_forces_in_trans,is_velocity);
          }
          else {
            EBGodunov::ComputeEdgeState
                      (bx,ncomp,q,face_x,face_y,face_z,u_mac,v_mac,w_mac,divu,fq,&geom,l_dt,h_bcrec,
                       d_bcrec,iconserv,
                       (Real *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&local_2b8,&apx
                       ,&apy,&apz,&vfrac,&fcx,&fcy,&fcz,&ccc,is_velocity,values_on_eb_inflow);
          }
          amrex::Gpu::Elixir::~Elixir(&eli);
          result.smallend.vect._0_8_ = &PTR__BaseFab_0074eb90;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)advection_type);
          if (iVar7 == 0) {
            bVar5 = amrex::EBFArrayBoxFactory::isAllRegular(ebfact);
            if (!bVar5) {
              amrex::Abort_host("BDS is not available with EB");
            }
            pGVar10 = &geom;
            puVar12 = (undefined8 *)&stack0xfffffffffffffba0;
            for (lVar11 = 0x19; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar12 = *(undefined8 *)&pGVar10->super_CoordSys;
              pGVar10 = (Geometry *)((long)pGVar10 + (ulong)bVar15 * -0x10 + 8);
              puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
            }
            geom_01.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffffbd0;
            geom_01.super_CoordSys.c_sys = in_stack_fffffffffffffba0._0_4_;
            geom_01.super_CoordSys._4_4_ = in_stack_fffffffffffffba0._4_4_;
            geom_01.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffffba0._8_8_;
            geom_01.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffffba0._16_8_;
            geom_01.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffffba0._24_8_;
            geom_01.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffffba0._32_8_;
            geom_01.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffffba0._40_8_;
            geom_01.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffffbd8;
            geom_01.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffffbe0;
            geom_01.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffffbe8;
            geom_01.super_CoordSys._80_8_ = in_stack_fffffffffffffbf0;
            geom_01.prob_domain.xlo[0] = (Real)in_stack_fffffffffffffbf8;
            geom_01.prob_domain.xlo[1] = (Real)in_stack_fffffffffffffc00;
            geom_01.prob_domain.xlo[2] = (Real)in_stack_fffffffffffffc08;
            geom_01.prob_domain.xhi[0] = (Real)in_stack_fffffffffffffc10;
            geom_01.prob_domain.xhi[1] = (Real)in_stack_fffffffffffffc18;
            geom_01.prob_domain.xhi[2] = (Real)in_stack_fffffffffffffc20;
            geom_01.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffffc28;
            geom_01.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffffc30;
            geom_01.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffffc38;
            geom_01.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffffc40;
            geom_01.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
            geom_01.roundoff_hi_f.arr[2] = (float)(int)in_stack_fffffffffffffc48;
            geom_01.domain.smallend.vect[0] = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
            geom_01.domain.smallend.vect[1] = (int)in_stack_fffffffffffffc50;
            geom_01.domain.smallend.vect[2] = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
            geom_01.domain.bigend.vect[0] = (int)in_stack_fffffffffffffc58;
            geom_01.domain.bigend.vect[1] = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
            geom_01.domain.bigend.vect[2] = (int)in_stack_fffffffffffffc60;
            geom_01.domain.btype.itype = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
            BDS::ComputeEdgeState
                      (bx,ncomp,q,face_x,face_y,face_z,u_mac,v_mac,w_mac,divu,fq,geom_01,l_dt,
                       d_bcrec,iconserv,is_velocity);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &result,"Unknown advection_type: ",advection_type);
            amrex::Abort((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result);
            if ((int *)result.smallend.vect._0_8_ != result.bigend.vect + 1) {
              operator_delete((void *)result.smallend.vect._0_8_,
                              CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) + 1);
            }
          }
        }
      }
    }
    if (FVar6 == regular) {
      result.smallend.vect._0_8_ = face_x->p;
      result.smallend.vect[2] = (int)face_x->jstride;
      result.bigend.vect[0] = (int)((ulong)face_x->jstride >> 0x20);
      result.bigend.vect[1] = (int)face_x->kstride;
      result.bigend.vect[2] = (int)((ulong)face_x->kstride >> 0x20);
      result.btype.itype = (uint)face_x->nstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)face_y->p;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)face_y->jstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)face_y->jstride >> 0x20);
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)face_y->kstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (int)((ulong)face_y->kstride >> 0x20);
      local_70.p = face_z->p;
      local_70.jstride = face_z->jstride;
      local_70.kstride = face_z->kstride;
      local_70.nstride = face_z->nstride;
      local_70.begin.z = (face_z->begin).z;
      local_70.begin.x = (face_z->begin).x;
      local_70.begin.y = (face_z->begin).y;
      local_70.end.x = (face_z->end).x;
      local_70.end.y = (face_z->end).y;
      local_70.end.z = (face_z->end).z;
      local_70.ncomp = face_z->ncomp;
      ComputeFluxes(bx,flux_x,flux_y,flux_z,u_mac,v_mac,w_mac,(Array4<const_double> *)&result,
                    (Array4<const_double> *)&eli,&local_70,&geom,ncomp,fluxes_are_area_weighted);
    }
    else {
      result.smallend.vect._0_8_ = face_x->p;
      result.smallend.vect[2] = (int)face_x->jstride;
      result.bigend.vect[0] = (int)((ulong)face_x->jstride >> 0x20);
      result.bigend.vect[1] = (int)face_x->kstride;
      result.bigend.vect[2] = (int)((ulong)face_x->kstride >> 0x20);
      result.btype.itype = (uint)face_x->nstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)face_y->p;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)face_y->jstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)face_y->jstride >> 0x20);
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)face_y->kstride;
      eli.m_pa.
      super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      .
      super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (int)((ulong)face_y->kstride >> 0x20);
      local_70.p = face_z->p;
      local_70.jstride = face_z->jstride;
      local_70.kstride = face_z->kstride;
      local_70.nstride = face_z->nstride;
      local_70.begin.z = (face_z->begin).z;
      local_70.begin.x = (face_z->begin).x;
      local_70.begin.y = (face_z->begin).y;
      local_70.end.x = (face_z->end).x;
      local_70.end.y = (face_z->end).y;
      local_70.end.z = (face_z->end).z;
      local_70.ncomp = face_z->ncomp;
      EB_ComputeFluxes(bx,flux_x,flux_y,flux_z,u_mac,v_mac,w_mac,(Array4<const_double> *)&result,
                       (Array4<const_double> *)&eli,&local_70,&apx,&apy,&apz,&geom,ncomp,&local_2b8,
                       fluxes_are_area_weighted);
    }
  }
  return;
}

Assistant:

void
HydroUtils::ComputeFluxesOnBoxFromState (Box const& bx, int ncomp, MFIter& mfi,
                                         Array4<Real const> const& q,
                                         AMREX_D_DECL(Array4<Real> const& flux_x,
                                                      Array4<Real> const& flux_y,
                                                      Array4<Real> const& flux_z),
                                         AMREX_D_DECL(Array4<Real> const& face_x,
                                         Array4<Real> const& face_y,
                                                      Array4<Real> const& face_z),
                                         bool knownFaceState,
                                         AMREX_D_DECL(Array4<Real const> const& u_mac,
                                                      Array4<Real const> const& v_mac,
                                                      Array4<Real const> const& w_mac),
                                         Array4<Real const> const& divu,
                                         Array4<Real const> const& fq,
                                         Geometry geom, Real l_dt,
                                         Vector<BCRec> const& h_bcrec,
                                         const BCRec* d_bcrec,
                                         int const* iconserv,
#ifdef AMREX_USE_EB
                                         const EBFArrayBoxFactory& ebfact,
                                         Array4<Real const> const& values_on_eb_inflow,
#endif
                                         bool godunov_use_ppm, bool godunov_use_forces_in_trans,
                                         bool is_velocity, bool fluxes_are_area_weighted,
                                         std::string& advection_type)

{
#ifdef AMREX_USE_EB
    EBCellFlagFab const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    Array4<EBCellFlag const> const& flag = flagfab.const_array();

    Array4<Real const> AMREX_D_DECL(fcx, fcy, fcz), ccc, vfrac, AMREX_D_DECL(apx, apy, apz);

    // If entire box is covered, don't do anything and return
    if (flagfab.getType(bx) == FabType::covered)
        return;

    //FIXME? -- Godunov needs to check on grow 3, but MOL only needs 2
    bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

    if (!regular)
    {
        vfrac = ebfact.getVolFrac().const_array(mfi);
        ccc   = ebfact.getCentroid().const_array(mfi);

        AMREX_D_TERM( apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
                      apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
                      apz = ebfact.getAreaFrac()[2]->const_array(mfi););

        AMREX_D_TERM( fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
                      fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
                      fcz = ebfact.getFaceCent()[2]->const_array(mfi););
    }
#endif

    if (!knownFaceState) {
        if (advection_type == "MOL")
        {
#ifdef AMREX_USE_EB
            if (!regular)
                EBMOL::ComputeEdgeState( bx,
                                         AMREX_D_DECL(face_x,face_y,face_z),
                                         q, ncomp,
                                         AMREX_D_DECL(u_mac,v_mac,w_mac),
                                         geom.Domain(), h_bcrec, d_bcrec,
                                         AMREX_D_DECL(fcx,fcy,fcz),
                                         ccc, vfrac, flag,
                                         is_velocity);
            else
#endif
                MOL::ComputeEdgeState( bx,
                                       AMREX_D_DECL(face_x,face_y,face_z),
                                       q, ncomp,
                                       AMREX_D_DECL(u_mac,v_mac,w_mac),
                                       geom.Domain(), h_bcrec, d_bcrec,
                                               is_velocity);

        } else if (advection_type == "Godunov") {

            int ngrow = 4; // NOT SURE ABOUT THIS
            FArrayBox tmpfab_v(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab_v.elixir();
#ifdef AMREX_USE_EB
            if (!regular)
                EBGodunov::ComputeEdgeState(bx, ncomp, q,
                                            AMREX_D_DECL(face_x,face_y,face_z),
                                            AMREX_D_DECL(u_mac,v_mac,w_mac),
                                            divu, fq,
                                            geom, l_dt,
                                            h_bcrec, d_bcrec, iconserv,
                                            tmpfab_v.dataPtr(), flag,
                                            AMREX_D_DECL(apx,apy,apz), vfrac,
                                            AMREX_D_DECL(fcx,fcy,fcz), ccc,
                                            is_velocity,
                                            values_on_eb_inflow);
            else
#endif

                Godunov::ComputeEdgeState(bx, ncomp, q,
                                          AMREX_D_DECL(face_x,face_y,face_z),
                                          AMREX_D_DECL(u_mac,v_mac,w_mac),
                                          divu, fq,
                                          geom,
                                          l_dt, d_bcrec, iconserv,
                                          godunov_use_ppm, godunov_use_forces_in_trans,
                                             is_velocity);
        } else if (advection_type == "BDS") {
#ifdef AMREX_USE_EB
            if (!ebfact.isAllRegular()) Abort("BDS is not available with EB");
#endif
            BDS::ComputeEdgeState( bx, ncomp, q,
                                   AMREX_D_DECL(face_x,face_y,face_z),
                                   AMREX_D_DECL(u_mac,v_mac,w_mac),
                                   divu, fq, geom,
                                   l_dt, d_bcrec, iconserv,
                                   is_velocity);
        } else {
            Abort("Unknown advection_type: "+advection_type);
        } // test advection type
    } // known face state

    // Compute fluxes
#ifdef AMREX_USE_EB
    if (!regular) {
        HydroUtils::EB_ComputeFluxes( bx,
                                      AMREX_D_DECL(flux_x,flux_y,flux_z),
                                      AMREX_D_DECL(u_mac,v_mac,w_mac),
                                      AMREX_D_DECL(face_x,face_y,face_z),
                                      AMREX_D_DECL(apx,apy,apz),
                                      geom, ncomp,
                                      flag, fluxes_are_area_weighted);
    } else
#endif
    {
        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL(flux_x,flux_y,flux_z),
                                   AMREX_D_DECL(u_mac,v_mac,w_mac),
                                   AMREX_D_DECL(face_x,face_y,face_z),
                                   geom, ncomp, fluxes_are_area_weighted );
    }
}